

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O1

timestamp_t
duckdb::TryCastDecimalCInternal<duckdb::timestamp_t>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  timestamp_t result_value;
  timestamp_t local_10;
  
  bVar1 = CastDecimalCInternal<duckdb::timestamp_t>(source,&local_10,col,row);
  if (!bVar1) {
    local_10 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  }
  return (timestamp_t)local_10.value;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}